

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.h
# Opt level: O3

bool __thiscall
CCommandBuffer::AddCommand<CCommandBuffer::CTextureCreateCommand>
          (CCommandBuffer *this,CTextureCreateCommand *Command)

{
  uint uVar1;
  uchar *puVar2;
  CCommand *pCVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  undefined4 uVar9;
  CCommand *pCVar10;
  ulong uVar11;
  ulong uVar12;
  
  puVar2 = (this->m_CmdBuffer).m_pData;
  uVar1 = (this->m_CmdBuffer).m_Used;
  uVar12 = (ulong)((int)puVar2 + uVar1 & 7);
  uVar11 = (uVar1 - uVar12) + 0x40;
  if (uVar11 <= (this->m_CmdBuffer).m_Size) {
    lVar8 = uVar1 - uVar12;
    (this->m_CmdBuffer).m_Used = (uint)uVar11;
    pCVar10 = (CCommand *)(puVar2 + lVar8 + 8);
    if (pCVar10 != (CCommand *)0x0) {
      uVar9 = *(undefined4 *)&(Command->super_CCommand).field_0x4;
      pCVar3 = (Command->super_CCommand).m_pNext;
      uVar4 = *(undefined8 *)&Command->m_Slot;
      uVar5 = *(undefined8 *)&Command->m_Height;
      uVar6 = *(undefined8 *)&Command->m_Format;
      uVar7 = *(undefined8 *)&Command->m_Flags;
      pCVar10->m_Cmd = (Command->super_CCommand).m_Cmd;
      *(undefined4 *)&pCVar10->field_0x4 = uVar9;
      *(CCommand **)(puVar2 + lVar8 + 0x10) = pCVar3;
      *(void **)(puVar2 + lVar8 + 0x38) = Command->m_pData;
      *(undefined8 *)(puVar2 + lVar8 + 0x28) = uVar6;
      *(undefined8 *)(puVar2 + lVar8 + 0x30) = uVar7;
      *(undefined8 *)(puVar2 + lVar8 + 0x18) = uVar4;
      *(undefined8 *)(puVar2 + lVar8 + 0x20) = uVar5;
      puVar2 = puVar2 + lVar8 + 0x10;
      puVar2[0] = '\0';
      puVar2[1] = '\0';
      puVar2[2] = '\0';
      puVar2[3] = '\0';
      puVar2[4] = '\0';
      puVar2[5] = '\0';
      puVar2[6] = '\0';
      puVar2[7] = '\0';
      if (this->m_pCmdBufferTail != (CCommand *)0x0) {
        this->m_pCmdBufferTail->m_pNext = pCVar10;
      }
      if (this->m_pCmdBufferHead == (CCommand *)0x0) {
        this->m_pCmdBufferHead = pCVar10;
      }
      this->m_pCmdBufferTail = pCVar10;
      return true;
    }
  }
  return false;
}

Assistant:

void *Alloc(unsigned Requested, unsigned Alignment = 8) // TODO: use alignof(std::max_align_t)
		{
			size_t Offset = Alignment - (reinterpret_cast<uintptr_t>(m_pData + m_Used) % Alignment);
			if(Requested + Offset + m_Used > m_Size)
				return 0;

			void *pPtr = &m_pData[m_Used + Offset];
			m_Used += Requested + Offset;
			return pPtr;
		}